

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O3

int doturn(void)

{
  char cVar1;
  monst *pmVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  monst *mtmp;
  
  if ((urole.malenum == 0x15f) || (urole.malenum == 0x161)) {
    u.uconduct.gnostic = u.uconduct.gnostic + 1;
    if (((u.ualign.type == -1) ||
        ((((youmonst.data)->mflags2 >> 9 & 1) == 0 && (((youmonst.data)->mflags2 & 2) == 0)))) &&
       (u.ugangr < 7)) {
      bVar3 = In_hell(&u.uz);
      pcVar8 = align_gname(u.ualign.type);
      if (bVar3 == '\0') {
        pline("Calling upon %s, you chant an arcane formula.",pcVar8);
        iVar7 = 1;
        exercise(2,'\x01');
        if (level->monlist != (monst *)0x0) {
          iVar4 = u.ulevel / 5 + 8;
          iVar9 = 0;
          mtmp = level->monlist;
          do {
            pmVar2 = mtmp->nmon;
            if (0 < mtmp->mhp) {
              if (((((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) ||
                   (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy),
                   iVar4 * iVar4 < iVar5)) || ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0)) ||
                 ((uVar6 = mtmp->data->mflags2, (uVar6 & 2) == 0 &&
                  (((uVar6 >> 9 & 1) == 0 || (u.ulevel < 0x10)))))) goto LAB_00226bc5;
              uVar6 = *(uint *)&mtmp->field_0x60 & 0xffb7ffff;
              *(uint *)&mtmp->field_0x60 = uVar6;
              if (u.uprops[0x1c].intrinsic != 0) {
                if (iVar9 == 0) {
                  pline("Unfortunately, your voice falters.");
                  uVar6 = *(uint *)&mtmp->field_0x60;
                }
                iVar9 = iVar9 + 1;
                mtmp->mfrozen = '\0';
                *(uint *)&mtmp->field_0x60 = uVar6 & 0xfffaffff | 0x40000;
                goto LAB_00226bc5;
              }
              iVar5 = resist(mtmp,'\0',0,1);
              if (iVar5 != 0) goto LAB_00226bc5;
              cVar1 = mtmp->data->mlet;
              switch(cVar1) {
              case '0':
                iVar5 = 0xc;
                break;
              case '1':
                iVar5 = 10;
                break;
              case '2':
              case '3':
              case '5':
                goto switchD_00226b64_caseD_32;
              case '4':
                iVar5 = 6;
                break;
              case '6':
                iVar5 = 0xe;
                break;
              default:
                if (cVar1 == '\'') {
                  iVar5 = 8;
                }
                else {
                  if (cVar1 != '&') goto switchD_00226b64_caseD_32;
                  iVar5 = 0x10;
                }
              }
              if ((u.ulevel < iVar5) || (iVar5 = resist(mtmp,'\0',0,0), iVar5 != 0)) {
switchD_00226b64_caseD_32:
                monflee(mtmp,0,'\0','\x01');
              }
              else if (u.ualign.type == -1) {
                mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
                set_malign(mtmp);
              }
              else {
                killed(mtmp);
              }
            }
LAB_00226bc5:
            mtmp = pmVar2;
          } while (pmVar2 != (monst *)0x0);
        }
        nomul(-5,"trying to turn the monsters");
      }
      else {
        iVar7 = 0;
        pline("Since you are in Gehennom, %s won\'t help you.",pcVar8);
        aggravate();
      }
    }
    else {
      align_gname(u.ualign.type);
      iVar7 = 0;
      pline("For some reason, %s seems to ignore you.");
      aggravate();
      exercise(2,'\0');
    }
  }
  else {
    if ((objects[0x19d].field_0x10 & 1) != 0) {
      lVar10 = 0;
      do {
        if (spl_book[lVar10].sp_id == 0) break;
        if (spl_book[lVar10].sp_id == 0x19d) {
          iVar7 = spelleffects((int)lVar10,'\x01');
          return iVar7;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x2b);
    }
    iVar7 = 0;
    pline("You don\'t know how to turn undead!");
  }
  return iVar7;
}

Assistant:

int doturn(void)
{	/* Knights & Priest(esse)s only please */

	struct monst *mtmp, *mtmp2;
	int once, range, xlev;

	if (!Role_if (PM_PRIEST) && !Role_if(PM_KNIGHT)) {
		/* Try to use turn undead spell. */
		if (objects[SPE_TURN_UNDEAD].oc_name_known) {
		    int sp_no;
		    for (sp_no = 0; sp_no < MAXSPELL &&
			 spl_book[sp_no].sp_id != NO_SPELL &&
			 spl_book[sp_no].sp_id != SPE_TURN_UNDEAD; sp_no++);

		    if (sp_no < MAXSPELL &&
			spl_book[sp_no].sp_id == SPE_TURN_UNDEAD)
			    return spelleffects(sp_no, TRUE);
		}

		pline("You don't know how to turn undead!");
		return 0;
	}
	u.uconduct.gnostic++;

	if ((u.ualign.type != A_CHAOTIC &&
		    (is_demon(youmonst.data) || is_undead(youmonst.data))) ||
				u.ugangr > 6 /* "Die, mortal!" */) {

		pline("For some reason, %s seems to ignore you.", u_gname());
		aggravate();
		exercise(A_WIS, FALSE);
		return 0;
	}

	if (Inhell) {
	    pline("Since you are in Gehennom, %s won't help you.", u_gname());
	    aggravate();
	    return 0;
	}
	pline("Calling upon %s, you chant an arcane formula.", u_gname());
	exercise(A_WIS, TRUE);

	/* note: does not perform unturn_dead() on victims' inventories */
	range = BOLT_LIM + (u.ulevel / 5);	/* 5 to 11 */
	range *= range;
	once = 0;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
	    mtmp2 = mtmp->nmon;

	    if (DEADMONSTER(mtmp)) continue;
	    if (!cansee(mtmp->mx,mtmp->my) ||
		distu(mtmp->mx,mtmp->my) > range) continue;

	    if (!mtmp->mpeaceful && (is_undead(mtmp->data) ||
		   (is_demon(mtmp->data) && (u.ulevel > (MAXULEV/2))))) {

		    mtmp->msleeping = 0;
		    if (Confusion) {
			if (!once++)
			    pline("Unfortunately, your voice falters.");
			mtmp->mflee = 0;
			mtmp->mfrozen = 0;
			mtmp->mcanmove = 1;
		    } else if (!resist(mtmp, '\0', 0, TELL)) {
			xlev = 6;
			switch (mtmp->data->mlet) {
			    /* this is intentional, lichs are tougher
			       than zombies. */
			case S_LICH:    xlev += 2;  /*FALLTHRU*/
			case S_GHOST:   xlev += 2;  /*FALLTHRU*/
			case S_VAMPIRE: xlev += 2;  /*FALLTHRU*/
			case S_WRAITH:  xlev += 2;  /*FALLTHRU*/
			case S_MUMMY:   xlev += 2;  /*FALLTHRU*/
			case S_ZOMBIE:
			    if (u.ulevel >= xlev &&
				    !resist(mtmp, '\0', 0, NOTELL)) {
				if (u.ualign.type == A_CHAOTIC) {
				    mtmp->mpeaceful = 1;
				    set_malign(mtmp);
				} else { /* damn them */
				    killed(mtmp);
				}
				break;
			    } /* else flee */
			    /*FALLTHRU*/
			default:
			    monflee(mtmp, 0, FALSE, TRUE);
			    break;
			}
		    }
	    }
	}
	nomul(-5, "trying to turn the monsters");
	return 1;
}